

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadModel(ParserImpl *this,ModelPtr *model,string *input)

{
  IssueImpl *pIVar1;
  element_type *peVar2;
  IssuePtr *pIVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer psVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  size_t sVar10;
  reference node_00;
  XmlNodePtr *node_01;
  XmlNodePtr *extraout_RDX;
  XmlNodePtr *node_02;
  XmlNodePtr *node_03;
  ulong index;
  pointer variable;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  *this_01;
  string *psVar11;
  string *psVar12;
  shared_ptr<libcellml::XmlNode> *connectionNode;
  pointer node_04;
  _Rb_tree_node_base *p_Var13;
  undefined1 auVar14 [16];
  IssuePtr IVar15;
  NamePairList usedConnections;
  string attributeName;
  DescriptionList issueList;
  IssuePtr issue_3;
  string uri_1;
  XmlNodePtr node;
  IssuePtr issue_9;
  IssuePtr issue_4;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  connectionNodes;
  XmlNodePtr childNode;
  IssuePtr issue_8;
  XmlDocPtr doc;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  encapsulationNodes;
  XmlAttributePtr attribute;
  XmlNamespaceMap elementNamespaceMap;
  NodeAttributeNamespaceInfo attributeNamespaceMap;
  
  std::make_shared<libcellml::XmlDoc>();
  XmlDoc::parse(doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_ptr,input);
  sVar10 = XmlDoc::xmlErrorCount
                     (doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (sVar10 != 0) {
    for (index = 0;
        sVar10 = XmlDoc::xmlErrorCount
                           (doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr), index < sVar10; index = index + 1) {
      Issue::IssueImpl::create();
      pIVar1 = (IssueImpl *)
               ((issueList.
                 super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first).
               super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      XmlDoc::xmlError_abi_cxx11_
                ((string *)&usedConnections,
                 doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_ptr,index)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elementNamespaceMap,"LibXml2 error: ",(string *)&usedConnections);
      Issue::IssueImpl::setDescription
                (pIVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &elementNamespaceMap);
      std::__cxx11::string::~string((string *)&elementNamespaceMap);
      std::__cxx11::string::~string((string *)&usedConnections);
      Issue::IssueImpl::setReferenceRule
                ((IssueImpl *)
                 ((issueList.
                   super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).
                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,XML);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&issueList);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &issueList.
                  super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  XmlDoc::rootNode((XmlDoc *)&node);
  if (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    pIVar1 = (IssueImpl *)
             ((usedConnections.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementNamespaceMap,
               "Could not get a valid XML root node from the provided input.",
               (allocator<char> *)&issueList);
    Issue::IssueImpl::setDescription(pIVar1,(string *)&elementNamespaceMap);
    std::__cxx11::string::~string((string *)&elementNamespaceMap);
    bVar7 = Strict::isStrict(&this->mParser->super_Strict);
    if (bVar7) {
      Issue::IssueImpl::setReferenceRule
                ((IssueImpl *)
                 ((usedConnections.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length,XML);
    }
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&usedConnections);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &usedConnections.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    bVar7 = XmlNode::isCellml20Element
                      (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"model");
    this->mParsing20Version = bVar7;
    traverseTreeForElementNamespaces_abi_cxx11_(&elementNamespaceMap,(libcellml *)&node,node_01);
    auVar14._8_8_ = extraout_RDX;
    auVar14._0_8_ = elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    node_02 = extraout_RDX;
    if (this->mParsing20Version == true) {
      while( true ) {
        node_02 = auVar14._8_8_;
        p_Var13 = auVar14._0_8_;
        if ((_Rb_tree_header *)p_Var13 == &elementNamespaceMap._M_t._M_impl.super__Rb_tree_header)
        break;
        std::__cxx11::string::string((string *)&usedConnections,(string *)(p_Var13 + 1));
        std::__cxx11::string::string((string *)&issueList,(string *)(p_Var13 + 2));
        bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&issueList,"http://www.cellml.org/cellml/2.0#");
        if ((bVar7) &&
           (bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&issueList,"http://www.w3.org/1998/Math/MathML"), bVar7)) {
          Issue::IssueImpl::create();
          pIVar1 = (IssueImpl *)
                   ((connectionNodes.
                     super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                   _M_pi;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_4,"Element \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &usedConnections);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issue_4,"\' uses namespace \'");
          std::operator+(&uri_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&issue_9,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issueList);
          std::operator+(&attributeName,&uri_1,"\' which does not belong to an allowed namespace. ")
          ;
          Issue::IssueImpl::setDescription(pIVar1,&attributeName);
          std::__cxx11::string::~string((string *)&attributeName);
          std::__cxx11::string::~string((string *)&uri_1);
          std::__cxx11::string::~string((string *)&issue_9);
          std::__cxx11::string::~string((string *)&issue_4);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     ((connectionNodes.
                       super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                     ._M_pi,XML_UNEXPECTED_NAMESPACE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&connectionNodes);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &connectionNodes.
                      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::__cxx11::string::~string((string *)&issueList);
        std::__cxx11::string::~string((string *)&usedConnections);
        auVar14 = std::_Rb_tree_increment(p_Var13);
      }
    }
    traverseTreeForAttributeNamespaces_abi_cxx11_(&attributeNamespaceMap,(libcellml *)&node,node_02)
    ;
    if (this->mParsing20Version == true) {
      for (psVar12 = (string *)
                     attributeNamespaceMap.
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          psVar12 !=
          (string *)
          attributeNamespaceMap.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; psVar12 = psVar12 + 0xa0) {
        std::__cxx11::string::string((string *)&usedConnections,psVar12 + 0x80);
        std::__cxx11::string::string((string *)&issueList,psVar12);
        std::__cxx11::string::string((string *)&attributeName,psVar12 + 0x60);
        std::__cxx11::string::string((string *)&uri_1,psVar12 + 0x20);
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&usedConnections,"cn");
        if (((((!bVar7) ||
              (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&issueList,"http://www.w3.org/1998/Math/MathML"), !bVar7))
             || (bVar7 = std::operator==(&attributeName,"units"), !bVar7)) ||
            (bVar7 = std::operator==(&uri_1,"http://www.cellml.org/cellml/2.0#"), !bVar7)) &&
           (((bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&usedConnections,"import"), !bVar7 ||
             (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&issueList,"http://www.cellml.org/cellml/2.0#"), !bVar7))
            || ((bVar7 = std::operator==(&attributeName,"href"), !bVar7 ||
                (bVar7 = std::operator==(&uri_1,"http://www.w3.org/1999/xlink"), !bVar7)))))) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &childNode,"Element \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &usedConnections);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attribute,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &childNode,"\' attribute \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &encapsulationNodes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attribute,&attributeName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connectionNodes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &encapsulationNodes,"\' has a namespace \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&connectionNodes,&uri_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issue_4,"\' specified.");
          Issue::IssueImpl::setDescription
                    (pIVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &issue_9);
          std::__cxx11::string::~string((string *)&issue_9);
          std::__cxx11::string::~string((string *)&issue_4);
          std::__cxx11::string::~string((string *)&connectionNodes);
          std::__cxx11::string::~string((string *)&encapsulationNodes);
          std::__cxx11::string::~string((string *)&attribute);
          std::__cxx11::string::~string((string *)&childNode);
          Issue::IssueImpl::setReferenceRule
                    ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_ATTRIBUTE_HAS_NAMESPACE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&uri_1);
        std::__cxx11::string::~string((string *)&attributeName);
        std::__cxx11::string::~string((string *)&issueList);
        std::__cxx11::string::~string((string *)&usedConnections);
      }
    }
    bVar7 = Strict::isStrict(&this->mParser->super_Strict);
    if (((bVar7) && (this->mParsing20Version != true)) ||
       (bVar7 = XmlNode::isCellmlElement
                          (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"model"), !bVar7)) {
      Issue::IssueImpl::create();
      XmlNode::name_abi_cxx11_
                ((string *)&usedConnections,
                 node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &usedConnections,"model");
      std::__cxx11::string::~string((string *)&usedConnections);
      if (bVar7) {
        XmlNode::namespaceUri_abi_cxx11_
                  ((string *)&usedConnections,
                   node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (usedConnections.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          std::__cxx11::string::assign((char *)&usedConnections);
        }
        bVar7 = Strict::isStrict(&this->mParser->super_Strict);
        if ((bVar7) &&
           (bVar7 = XmlNode::isCellml1XElement
                              (node.
                               super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,"model"), bVar7)) {
          pIVar1 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          nodesCellMl1XVersion_abi_cxx11_(&uri_1,(libcellml *)&node,node_03);
          std::operator+(&attributeName,"Given model is a CellML ",&uri_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issueList,&attributeName," model but strict parsing mode is on.");
          Issue::IssueImpl::setDescription(pIVar1,(string *)&issueList);
          std::__cxx11::string::~string((string *)&issueList);
          std::__cxx11::string::~string((string *)&attributeName);
          psVar11 = &uri_1;
        }
        else {
          std::operator+(&attributeName,"Model element is in an invalid namespace \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &usedConnections);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issueList,&attributeName,"\'.");
          std::__cxx11::string::~string((string *)&attributeName);
          bVar7 = Strict::isStrict(&this->mParser->super_Strict);
          if (bVar7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&issue_9,"http://www.cellml.org/cellml/2.0#",
                       (allocator<char> *)&connectionNodes);
            std::operator+(&uri_1," A valid CellML root node should be in the namespace \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_9);
            std::operator+(&attributeName,&uri_1,"\'.");
            std::__cxx11::string::append((string *)&issueList);
            std::__cxx11::string::~string((string *)&attributeName);
            std::__cxx11::string::~string((string *)&uri_1);
            std::__cxx11::string::~string((string *)&issue_9);
          }
          Issue::IssueImpl::setDescription
                    ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,(string *)&issueList);
          psVar11 = (string *)&issueList;
        }
        std::__cxx11::string::~string((string *)psVar11);
        psVar11 = (string *)&usedConnections;
      }
      else {
        pIVar1 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        XmlNode::name_abi_cxx11_
                  (&attributeName,
                   node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issueList,"Model element is of invalid type \'",&attributeName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &usedConnections,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issueList,"\'. A valid CellML root node should be of type \'model\'.");
        Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
        std::__cxx11::string::~string((string *)&usedConnections);
        std::__cxx11::string::~string((string *)&issueList);
        psVar11 = &attributeName;
      }
      std::__cxx11::string::~string((string *)psVar11);
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,model,MODEL);
      bVar7 = Strict::isStrict(&this->mParser->super_Strict);
      if (bVar7) {
        Issue::IssueImpl::setReferenceRule
                  ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,XML_UNEXPECTED_ELEMENT);
      }
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_4);
      pIVar3 = &issue_4;
    }
    else {
      bVar7 = XmlNode::isCellml1XElement
                        (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"model");
      this->mParsing1XVersion = bVar7;
      if (bVar7) {
        IVar15 = Issue::IssueImpl::create();
        pIVar1 = *(IssueImpl **)(uri_1._M_dataplus._M_p + 8);
        nodesCellMl1XVersion_abi_cxx11_
                  (&attributeName,(libcellml *)&node,
                   (XmlNodePtr *)
                   IVar15.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issueList,"Given model is a CellML ",&attributeName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &usedConnections,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issueList,
                       " model, the parser will try to represent this model in CellML 2.0.");
        Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
        std::__cxx11::string::~string((string *)&usedConnections);
        std::__cxx11::string::~string((string *)&issueList);
        std::__cxx11::string::~string((string *)&attributeName);
        Issue::IssueImpl::setLevel(*(IssueImpl **)(uri_1._M_dataplus._M_p + 8),MESSAGE);
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(uri_1._M_dataplus._M_p + 8) + 0x28),model,MODEL);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&uri_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri_1._M_string_length);
      }
      XmlNode::firstAttribute((XmlNode *)&attribute);
      bVar7 = false;
      while (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0) {
        bVar8 = XmlAttribute::isType
                          (attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"name","");
        if (bVar8) {
          peVar2 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          XmlAttribute::value_abi_cxx11_
                    ((string *)&usedConnections,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          NamedEntity::setName((NamedEntity *)peVar2,(string *)&usedConnections);
          std::__cxx11::string::~string((string *)&usedConnections);
          bVar7 = true;
        }
        else {
          bVar8 = isIdAttribute(&attribute,this->mParsing1XVersion);
          if (bVar8) {
            peVar2 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            XmlAttribute::value_abi_cxx11_
                      ((string *)&usedConnections,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            Entity::setId((Entity *)peVar2,(string *)&usedConnections);
            std::__cxx11::string::~string((string *)&usedConnections);
          }
          else {
            Issue::IssueImpl::create();
            pIVar1 = (IssueImpl *)
                     ((connectionNodes.
                       super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                     ._M_pi;
            if (this->mParsing1XVersion == true) {
              XmlNode::attribute_abi_cxx11_
                        ((string *)&issue_9,
                         node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"name");
              std::operator+(&uri_1,"Model \'",(string *)&issue_9);
              std::operator+(&attributeName,&uri_1,"\' ignoring attribute \'");
              XmlAttribute::name_abi_cxx11_
                        ((string *)&issue_4,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,&attributeName,(string *)&issue_4);
              std::operator+((string *)&usedConnections,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
              std::__cxx11::string::~string((string *)&usedConnections);
              std::__cxx11::string::~string((string *)&issueList);
              std::__cxx11::string::~string((string *)&issue_4);
              std::__cxx11::string::~string((string *)&attributeName);
              std::__cxx11::string::~string((string *)&uri_1);
              std::__cxx11::string::~string((string *)&issue_9);
              Issue::IssueImpl::setLevel
                        ((IssueImpl *)
                         ((connectionNodes.
                           super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi,MESSAGE);
            }
            else {
              XmlNode::attribute_abi_cxx11_
                        ((string *)&issue_9,
                         node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"name");
              std::operator+(&uri_1,"Model \'",(string *)&issue_9);
              std::operator+(&attributeName,&uri_1,"\' has an invalid attribute \'");
              XmlAttribute::name_abi_cxx11_
                        ((string *)&issue_4,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,&attributeName,(string *)&issue_4);
              std::operator+((string *)&usedConnections,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
              std::__cxx11::string::~string((string *)&usedConnections);
              std::__cxx11::string::~string((string *)&issueList);
              std::__cxx11::string::~string((string *)&issue_4);
              std::__cxx11::string::~string((string *)&attributeName);
              std::__cxx11::string::~string((string *)&uri_1);
              std::__cxx11::string::~string((string *)&issue_9);
              Issue::IssueImpl::setReferenceRule
                        ((IssueImpl *)
                         ((connectionNodes.
                           super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi,MODEL_ELEMENT);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setModel
                      ((AnyCellmlElementImpl *)
                       **(undefined8 **)
                         &((connectionNodes.
                            super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi[2]._M_use_count,model,MODEL);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&connectionNodes);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &connectionNodes.
                        super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        XmlAttribute::next((XmlAttribute *)&usedConnections);
        std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)
                   &usedConnections);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &usedConnections.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (!bVar7 && (this->mParsing1XVersion & 1U) == 0) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 ((issueList.
                   super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).
                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedConnections,"Model does not have a name attribute.",
                   (allocator<char> *)&attributeName);
        Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
        std::__cxx11::string::~string((string *)&usedConnections);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   ((issueList.
                     super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first).
                   super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,MODEL_NAME);
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)
                     &((issueList.
                        super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first).
                      super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[2]._M_use_count,model,MODEL);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&issueList);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &issueList.
                    super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      XmlNode::firstChild((XmlNode *)&childNode);
      connectionNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      connectionNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      connectionNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      encapsulationNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      encapsulationNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      encapsulationNodes.
      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0) {
        bVar7 = parseNode(this,(XmlNodePtr *)
                               &childNode.
                                super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                          "component");
        if (bVar7) {
          Component::create();
          loadComponent(this,(ComponentPtr *)&usedConnections,
                        (XmlNodePtr *)
                        &childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
          ComponentEntity::addComponent
                    (&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ComponentEntity,(ComponentPtr *)&usedConnections);
          if (this->mParsing1XVersion == true) {
            loadUnitsFromComponent
                      (this,model,
                       (XmlNodePtr *)
                       &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                      );
          }
LAB_001f8879:
          this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    &usedConnections.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
LAB_001f887e:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
        }
        else {
          bVar7 = parseNode(this,(XmlNodePtr *)
                                 &childNode.
                                  super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                            ,"units");
          if (bVar7) {
            Units::create();
            loadUnits(this,(UnitsPtr *)&usedConnections,
                      (XmlNodePtr *)
                      &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)
            ;
            Model::addUnits((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr,(UnitsPtr *)&usedConnections);
            goto LAB_001f8879;
          }
          bVar7 = parseNode(this,(XmlNodePtr *)
                                 &childNode.
                                  super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                            ,"import");
          if (bVar7) {
            ImportSource::create();
            loadImport(this,(ImportSourcePtr *)&usedConnections,model,
                       (XmlNodePtr *)
                       &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                      );
            goto LAB_001f8879;
          }
          bVar7 = XmlNode::isCellml20Element
                            (childNode.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,"encapsulation");
          if (bVar7) {
            XmlNode::firstAttribute((XmlNode *)&usedConnections);
            ppVar4 = usedConnections.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &usedConnections.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            if (ppVar4 != (pointer)0x0) {
              XmlNode::firstAttribute((XmlNode *)&issue_3);
              while (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     != (element_type *)0x0) {
                bVar7 = isIdAttribute((XmlAttributePtr *)&issue_3,false);
                if (bVar7) {
                  peVar2 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr;
                  XmlAttribute::value_abi_cxx11_
                            ((string *)&usedConnections,
                             (XmlAttribute *)
                             issue_3.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  ComponentEntity::setEncapsulationId
                            (&peVar2->super_ComponentEntity,(string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&usedConnections);
                }
                else {
                  Issue::IssueImpl::create();
                  pIVar1 = (issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl;
                  NamedEntity::name_abi_cxx11_
                            ((string *)&issue_9,
                             (NamedEntity *)
                             (model->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  std::operator+(&uri_1,"Encapsulation in model \'",(string *)&issue_9);
                  std::operator+(&attributeName,&uri_1,"\' has an invalid attribute \'");
                  XmlAttribute::name_abi_cxx11_
                            ((string *)&issue_4,
                             (XmlAttribute *)
                             issue_3.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,&attributeName,(string *)&issue_4);
                  std::operator+((string *)&usedConnections,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,"\'.");
                  Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&issueList);
                  std::__cxx11::string::~string((string *)&issue_4);
                  std::__cxx11::string::~string((string *)&attributeName);
                  std::__cxx11::string::~string((string *)&uri_1);
                  std::__cxx11::string::~string((string *)&issue_9);
                  AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                            ((((issue_8.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->mPimpl->mItem).
                              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->mPimpl,model);
                  Issue::IssueImpl::setReferenceRule
                            ((issue_8.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,ENCAPSULATION_ELEMENT);
                  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&issue_8.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                }
                XmlAttribute::next((XmlAttribute *)&usedConnections);
                std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)
                           &issue_3,(__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                     *)&usedConnections);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &usedConnections.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            XmlNode::firstChild((XmlNode *)&uri_1);
            if (uri_1._M_dataplus._M_p == (pointer)0x0) {
              Issue::IssueImpl::create();
              pIVar1 = (issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              NamedEntity::name_abi_cxx11_
                        (&attributeName,
                         (NamedEntity *)
                         (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,"Encapsulation in model \'",&attributeName);
              std::operator+((string *)&usedConnections,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issueList,"\' does not contain any child elements.");
              Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
              std::__cxx11::string::~string((string *)&usedConnections);
              std::__cxx11::string::~string((string *)&issueList);
              std::__cxx11::string::~string((string *)&attributeName);
              AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                        ((((issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,model);
              Issue::IssueImpl::setReferenceRule
                        ((issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,ENCAPSULATION_CHILD);
              Issue::IssueImpl::setLevel
                        ((issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,WARNING);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_9);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              std::
              vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
              ::push_back(&encapsulationNodes,
                          (value_type *)
                          &childNode.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
            }
            this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri_1._M_string_length;
            goto LAB_001f887e;
          }
          bVar7 = XmlNode::isCellml20Element
                            (childNode.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,"connection");
          this_01 = &connectionNodes;
          if (bVar7) {
LAB_001f8ac2:
            std::
            vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
            ::push_back(this_01,(value_type *)
                                &childNode.
                                 super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)
            ;
          }
          else {
            bVar7 = XmlNode::isText(childNode.
                                    super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
            if (bVar7) {
              XmlNode::convertToString_abi_cxx11_
                        ((string *)&usedConnections,
                         childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              bVar7 = hasNonWhitespaceCharacters((string *)&usedConnections);
              if (bVar7) {
                Issue::IssueImpl::create();
                pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                NamedEntity::name_abi_cxx11_
                          ((string *)&issue_4,
                           (NamedEntity *)
                           (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_9,"Model \'",(string *)&issue_4);
                std::operator+(&uri_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&issue_9,
                               "\' has an invalid non-whitespace child text element \'");
                std::operator+(&attributeName,&uri_1,(string *)&usedConnections);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issueList,&attributeName,"\'.");
                Issue::IssueImpl::setDescription
                          (pIVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issueList);
                std::__cxx11::string::~string((string *)&issueList);
                std::__cxx11::string::~string((string *)&attributeName);
                std::__cxx11::string::~string((string *)&uri_1);
                std::__cxx11::string::~string((string *)&issue_9);
                std::__cxx11::string::~string((string *)&issue_4);
                AnyCellmlElement::AnyCellmlElementImpl::setModel
                          ((((issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,model,MODEL);
                Issue::IssueImpl::setReferenceRule
                          ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              std::__cxx11::string::~string((string *)&usedConnections);
            }
            else {
              bVar9 = this->mParsing1XVersion;
              if ((bool)bVar9 == true) {
                bVar7 = XmlNode::isCellml1XElement
                                  (childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,"group");
                if (bVar7) {
                  bVar7 = isEncapsulationRelationship
                                    ((XmlNodePtr *)
                                     &childNode.
                                      super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                    );
                  this_01 = &encapsulationNodes;
                  if (bVar7) goto LAB_001f8ac2;
                  goto LAB_001f8883;
                }
                bVar9 = this->mParsing1XVersion;
              }
              if ((bVar9 & 1) != 0) {
                bVar7 = XmlNode::isCellml1XElement
                                  (childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,"connection");
                this_01 = &connectionNodes;
                if (bVar7) goto LAB_001f8ac2;
              }
              bVar7 = XmlNode::isComment(childNode.
                                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
              if (!bVar7) {
                Issue::IssueImpl::create();
                pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                if (this->mParsing1XVersion == true) {
                  NamedEntity::name_abi_cxx11_
                            ((string *)&issue_9,
                             (NamedEntity *)
                             (model->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  std::operator+(&uri_1,"Model \'",(string *)&issue_9);
                  std::operator+(&attributeName,&uri_1,"\' ignoring child element \'");
                  XmlNode::name_abi_cxx11_
                            ((string *)&issue_4,
                             childNode.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,&attributeName,(string *)&issue_4);
                  std::operator+((string *)&usedConnections,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,"\'.");
                  Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&issueList);
                  std::__cxx11::string::~string((string *)&issue_4);
                  std::__cxx11::string::~string((string *)&attributeName);
                  std::__cxx11::string::~string((string *)&uri_1);
                  std::__cxx11::string::~string((string *)&issue_9);
                  Issue::IssueImpl::setLevel
                            ((issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,MESSAGE);
                }
                else {
                  NamedEntity::name_abi_cxx11_
                            ((string *)&issue_9,
                             (NamedEntity *)
                             (model->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  std::operator+(&uri_1,"Model \'",(string *)&issue_9);
                  std::operator+(&attributeName,&uri_1,"\' has an invalid child element \'");
                  XmlNode::name_abi_cxx11_
                            ((string *)&issue_4,
                             childNode.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,&attributeName,(string *)&issue_4);
                  std::operator+((string *)&usedConnections,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issueList,"\'.");
                  Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&usedConnections);
                  std::__cxx11::string::~string((string *)&issueList);
                  std::__cxx11::string::~string((string *)&issue_4);
                  std::__cxx11::string::~string((string *)&attributeName);
                  std::__cxx11::string::~string((string *)&uri_1);
                  std::__cxx11::string::~string((string *)&issue_9);
                  Issue::IssueImpl::setReferenceRule
                            ((issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,XML_UNEXPECTED_ELEMENT);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setModel
                          ((((issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,model,MODEL);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
                this_00 = &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                goto LAB_001f887e;
              }
            }
          }
        }
LAB_001f8883:
        XmlNode::next((XmlNode *)&usedConnections);
        std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&usedConnections)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &usedConnections.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (encapsulationNodes.
          super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          encapsulationNodes.
          super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        node_00 = std::
                  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                  ::at(&encapsulationNodes,0);
        loadEncapsulation(this,model,node_00);
        if (0x10 < (ulong)((long)encapsulationNodes.
                                 super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)encapsulationNodes.
                                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          Issue::IssueImpl::create();
          pIVar1 = *(IssueImpl **)(uri_1._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&attributeName,
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issueList,"Model \'",&attributeName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &usedConnections,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issueList,"\' has more than one encapsulation element.");
          Issue::IssueImpl::setDescription(pIVar1,(string *)&usedConnections);
          std::__cxx11::string::~string((string *)&usedConnections);
          std::__cxx11::string::~string((string *)&issueList);
          std::__cxx11::string::~string((string *)&attributeName);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(uri_1._M_dataplus._M_p + 8) + 0x28),model);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(uri_1._M_dataplus._M_p + 8),MODEL_MORE_THAN_ONE_ENCAPSULATION);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&uri_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri_1._M_string_length);
        }
      }
      psVar6 = connectionNodes.
               super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      usedConnections.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      usedConnections.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      usedConnections.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (node_04 = connectionNodes.
                     super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; node_04 != psVar6;
          node_04 = node_04 + 1) {
        loadConnection(this,model,node_04,&usedConnections);
      }
      issueList.
      super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      issueList.
      super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      issueList.
      super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Model,void>
                ((__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2> *)
                 &attributeName,
                 &model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
      traverseComponentEntityTreeLinkingUnits((ComponentEntityPtr *)&attributeName,&issueList);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attributeName._M_string_length);
      ppVar5 = issueList.
               super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (variable = issueList.
                      super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; variable != ppVar5;
          variable = variable + 1) {
        Issue::IssueImpl::create();
        Issue::IssueImpl::setDescription
                  (*(IssueImpl **)(attributeName._M_dataplus._M_p + 8),&variable->second);
        Issue::IssueImpl::setLevel(*(IssueImpl **)(attributeName._M_dataplus._M_p + 8),WARNING);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(attributeName._M_dataplus._M_p + 8),VARIABLE_ELEMENT);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(attributeName._M_dataplus._M_p + 8) + 0x28),
                   &variable->first);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&attributeName);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attributeName._M_string_length);
      }
      std::
      vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&issueList);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&usedConnections);
      std::
      vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ::~vector(&encapsulationNodes);
      std::
      vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
      ::~vector(&connectionNodes);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pIVar3 = (IssuePtr *)&attribute;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pIVar3->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&attributeNamespaceMap);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&elementNamespaceMap._M_t);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Parser::ParserImpl::loadModel(const ModelPtr &model, const std::string &input)
{
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(input);
    // Copy any XML parsing issues into the common parser issue handler.
    if (doc->xmlErrorCount() > 0) {
        for (size_t i = 0; i < doc->xmlErrorCount(); ++i) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("LibXml2 error: " + doc->xmlError(i));
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
            addIssue(issue);
        }
    }
    const XmlNodePtr node = doc->rootNode();
    if (!node) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Could not get a valid XML root node from the provided input.");
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        }
        addIssue(issue);
        return;
    }

    mParsing20Version = node->isCellml20Element("model");

    auto elementNamespaceMap = traverseTreeForElementNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : elementNamespaceMap) {
            std::string name = e.first;
            std::string uri = e.second;
            if ((uri != CELLML_2_0_NS) && (uri != MATHML_NS)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + name + "' uses namespace '" + uri + "' which does not belong to an allowed namespace. ");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    auto attributeNamespaceMap = traverseTreeForAttributeNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : attributeNamespaceMap) {
            std::string nodeName = std::get<0>(e);
            std::string nodeUri = std::get<4>(e);
            std::string attributeName = std::get<1>(e);
            std::string uri = std::get<3>(e);
            if ((nodeName == "cn") && (nodeUri == MATHML_NS) && (attributeName == "units") && (uri == CELLML_2_0_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else if ((nodeName == "import") && (nodeUri == CELLML_2_0_NS) && (attributeName == "href") && (uri == XLINK_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + nodeName + "' attribute '" + attributeName + "' has a namespace '" + uri + "' specified.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ATTRIBUTE_HAS_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    if ((mParser->isStrict() && !mParsing20Version) || !node->isCellmlElement("model")) {
        auto issue = Issue::IssueImpl::create();
        if (node->name() == "model") {
            std::string nodeNamespace = node->namespaceUri();
            if (nodeNamespace.empty()) {
                nodeNamespace = "null";
            }
            if (mParser->isStrict() && node->isCellml1XElement("model")) {
                issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model but strict parsing mode is on.");
            } else {
                std::string message = "Model element is in an invalid namespace '" + nodeNamespace + "'.";
                if (mParser->isStrict()) {
                    message += " A valid CellML root node should be in the namespace '" + std::string(CELLML_2_0_NS) + "'.";
                }
                issue->mPimpl->setDescription(message);
            }
        } else {
            issue->mPimpl->setDescription("Model element is of invalid type '" + node->name() + "'. A valid CellML root node should be of type 'model'.");
        }
        issue->mPimpl->mItem->mPimpl->setModel(model);
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
        }
        addIssue(issue);
        return;
    }
    mParsing1XVersion = node->isCellml1XElement("model");
    if (mParsing1XVersion) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model, the parser will try to represent this model in CellML 2.0.");
        issue->mPimpl->setLevel(Issue::Level::MESSAGE);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }
    // Get model attributes.
    bool nameAttributePresent = false;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            model->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            model->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!mParsing1XVersion && !nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model does not have a name attribute.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_NAME);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }

    // Get model children (CellML entities).
    XmlNodePtr childNode = node->firstChild();
    std::vector<XmlNodePtr> connectionNodes;
    std::vector<XmlNodePtr> encapsulationNodes;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            auto component = Component::create();
            loadComponent(component, childNode);
            model->addComponent(component);
            if (mParsing1XVersion) {
                loadUnitsFromComponent(model, childNode);
            }
        } else if (parseNode(childNode, "units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        } else if (parseNode(childNode, "import")) {
            ImportSourcePtr importSource = ImportSource::create();
            loadImport(importSource, model, childNode);
        } else if (childNode->isCellml20Element("encapsulation")) {
            // An encapsulation should not have attributes other than an 'id' attribute.
            if (childNode->firstAttribute()) {
                XmlAttributePtr childAttribute = childNode->firstAttribute();
                while (childAttribute) {
                    if (isIdAttribute(childAttribute, false)) {
                        model->setEncapsulationId(childAttribute->value());
                    } else {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid attribute '" + childAttribute->name() + "'.");
                        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_ELEMENT);
                        addIssue(issue);
                    }
                    childAttribute = childAttribute->next();
                }
            }
            // Load encapsulated component_refs.
            XmlNodePtr componentRefNode = childNode->firstChild();
            if (componentRefNode != nullptr) {
                // This component_ref and its child and sibling elements will be loaded
                // and issue-checked in loadEncapsulation().
                encapsulationNodes.push_back(childNode);
            } else {
                // Empty encapsulations are valid, but may not be intended.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not contain any child elements.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
                addIssue(issue);
            }
        } else if (childNode->isCellml20Element("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("group")) {
            if (isEncapsulationRelationship(childNode)) {
                encapsulationNodes.push_back(childNode);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + model->name() + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    if (!encapsulationNodes.empty()) {
        loadEncapsulation(model, encapsulationNodes.at(0));
        if (encapsulationNodes.size() > 1) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Model '" + model->name() + "' has more than one encapsulation element.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_MORE_THAN_ONE_ENCAPSULATION);
            addIssue(issue);
        }
    }

    NamePairList usedConnections;
    for (const auto &connectionNode : connectionNodes) {
        loadConnection(model, connectionNode, usedConnections);
    }

    // Link units to their names.
    DescriptionList issueList;
    traverseComponentEntityTreeLinkingUnits(model, issueList);
    for (const auto &entry : issueList) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(entry.second);
        issue->mPimpl->setLevel(Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ELEMENT);
        issue->mPimpl->mItem->mPimpl->setVariable(entry.first);
        addIssue(issue);
    }
}